

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O1

void __thiscall libcalc::Tokenizer::parse(Tokenizer *this,string *expression)

{
  pointer *pppTVar1;
  char symbol;
  iterator iVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  Token *pTVar6;
  size_type sVar7;
  Token *local_38;
  Token *t;
  
  pTVar6 = (Token *)operator_new(0x28);
  Token::Token(pTVar6);
  iVar2._M_current =
       (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38 = pTVar6;
  if (iVar2._M_current ==
      (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
    _M_realloc_insert<libcalc::Token*const&>
              ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)this,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = pTVar6;
    pppTVar1 = &(this->tokens).
                super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  sVar3 = expression->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (expression->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      symbol = pcVar4[sVar7];
      bVar5 = Token::push(local_38,symbol);
      if (!bVar5) {
        pTVar6 = (Token *)operator_new(0x28);
        Token::Token(pTVar6,symbol);
        iVar2._M_current =
             (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_38 = pTVar6;
        if (iVar2._M_current ==
            (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
          _M_realloc_insert<libcalc::Token*const&>
                    ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)this,iVar2,&local_38
                    );
        }
        else {
          *iVar2._M_current = pTVar6;
          pppTVar1 = &(this->tokens).
                      super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  return;
}

Assistant:

void Tokenizer::parse(std::string expression) {
  Token *t = new Token();
  tokens.push_back(t);

  for (char e : expression) {
    if (!t->push(e)) {
      t = new Token(e);
      tokens.push_back(t);
    }
  }
}